

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preserve_unknown_enum_test.cc
# Opt level: O0

void __thiscall
google::protobuf::PreserveUnknownEnumTest_Proto2HidesUnknownValues_Test::
~PreserveUnknownEnumTest_Proto2HidesUnknownValues_Test
          (PreserveUnknownEnumTest_Proto2HidesUnknownValues_Test *this)

{
  PreserveUnknownEnumTest_Proto2HidesUnknownValues_Test *this_local;
  
  ~PreserveUnknownEnumTest_Proto2HidesUnknownValues_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PreserveUnknownEnumTest, Proto2HidesUnknownValues) {
  proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra orig_message;
  FillMessage(&orig_message);

  std::string serialized;
  orig_message.SerializeToString(&serialized);

  proto2_preserve_unknown_enum_unittest::MyMessage message;
  EXPECT_EQ(true, message.ParseFromString(serialized));
  // The intermediate message has everything in its "unknown fields".
  proto2_preserve_unknown_enum_unittest::MyMessage message2 = message;
  message2.DiscardUnknownFields();
  EXPECT_EQ(0, message2.ByteSizeLong());

  // But when we pass it to the correct structure, all values are there.
  serialized.clear();
  message.SerializeToString(&serialized);
  EXPECT_EQ(true, orig_message.ParseFromString(serialized));
  CheckMessage(orig_message);
}